

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O2

mraa_result_t mraa_lec_al_get_pin_index(mraa_board_t *board,char *name,int *pin_index)

{
  int iVar1;
  mraa_result_t extraout_EAX;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)board->phy_pin_count;
  if (board->phy_pin_count < 1) {
    uVar3 = uVar2;
  }
  uVar4 = 0;
  while( true ) {
    if (uVar3 == uVar4) {
      syslog(2,"lec_al: Failed to find pin name %s",name);
      return extraout_EAX;
    }
    iVar1 = strncmp(name,board->pins->name + uVar2,0xc);
    if (iVar1 == 0) break;
    uVar4 = uVar4 + 1;
    uVar2 = uVar2 + 0x2f4;
  }
  *pin_index = (int)uVar4;
  return (mraa_result_t)pin_index;
}

Assistant:

static mraa_result_t mraa_lec_al_get_pin_index(mraa_board_t* board, char* name, int* pin_index)
{
	int i;
	for (i = 0; i < board->phy_pin_count; ++i) {
		if (strncmp(name, board->pins[i].name, MRAA_PIN_NAME_SIZE) == 0) {
			*pin_index = i;
			return MRAA_SUCCESS;
		}
	}

	syslog(LOG_CRIT, "lec_al: Failed to find pin name %s", name);

	return MRAA_ERROR_INVALID_RESOURCE;
}